

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::js::Generator::FindProvidesForFields
          (Generator *this,GeneratorOptions *options,Printer *printer,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *provided)

{
  size_type *psVar1;
  ulong uVar2;
  _anonymous_namespace_ *this_00;
  int iVar3;
  pointer ppFVar4;
  long *plVar5;
  undefined8 *puVar6;
  FieldDescriptor *field;
  FileDescriptor *file;
  ulong uVar7;
  undefined8 uVar8;
  FileDescriptor *pFVar9;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  FieldDescriptor *local_80;
  GeneratorOptions *local_78;
  ulong local_70;
  long lStack_68;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_60;
  GeneratorOptions *local_58;
  string local_50;
  
  ppFVar4 = (fields->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((fields->
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar4) {
    pFVar9 = (FileDescriptor *)0x0;
    file = (FileDescriptor *)fields;
    local_60 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)provided;
    local_58 = options;
    do {
      this_00 = (_anonymous_namespace_ *)ppFVar4[(long)pFVar9];
      if (this_00[0x50] == (_anonymous_namespace_)0x1) {
        iVar3 = std::__cxx11::string::compare
                          ((char *)**(undefined8 **)(*(long *)(this_00 + 0x58) + 0x10));
        if (iVar3 != 0) goto LAB_0021f3fe;
      }
      else {
LAB_0021f3fe:
        (anonymous_namespace)::GetFilePath_abi_cxx11_
                  (&local_50,(_anonymous_namespace_ *)local_58,
                   *(GeneratorOptions **)(this_00 + 0x30),file);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
        field = (FieldDescriptor *)(plVar5 + 2);
        if ((FieldDescriptor *)*plVar5 == field) {
          local_70 = *(ulong *)field;
          lStack_68 = plVar5[3];
          local_80 = (FieldDescriptor *)&local_70;
        }
        else {
          local_70 = *(ulong *)field;
          local_80 = (FieldDescriptor *)*plVar5;
        }
        local_78 = (GeneratorOptions *)plVar5[1];
        *plVar5 = (long)field;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        (anonymous_namespace)::JSObjectFieldName_abi_cxx11_(&local_a0,this_00,local_78,field);
        uVar7 = 0xf;
        if (local_80 != (FieldDescriptor *)&local_70) {
          uVar7 = local_70;
        }
        uVar2 = (long)&(local_78->output_dir)._M_dataplus._M_p + local_a0._M_string_length;
        if (uVar7 < uVar2) {
          uVar8 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            uVar8 = local_a0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar8 < uVar2) goto LAB_0021f4b0;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_80);
        }
        else {
LAB_0021f4b0:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_80,(ulong)local_a0._M_dataplus._M_p);
        }
        psVar1 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_c0.field_2._M_allocated_capacity = *psVar1;
          local_c0.field_2._8_8_ = puVar6[3];
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        }
        else {
          local_c0.field_2._M_allocated_capacity = *psVar1;
          local_c0._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_c0._M_string_length = puVar6[1];
        *puVar6 = psVar1;
        puVar6[1] = 0;
        *(undefined1 *)psVar1 = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if (local_80 != (FieldDescriptor *)&local_70) {
          operator_delete(local_80,local_70 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>(local_60,&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
      }
      pFVar9 = pFVar9 + 1;
      ppFVar4 = (fields->
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      file = (FileDescriptor *)
             ((long)(fields->
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar4 >> 3);
    } while (pFVar9 < file);
  }
  return;
}

Assistant:

void Generator::FindProvidesForFields(
    const GeneratorOptions& options,
    io::Printer* printer,
    const std::vector<const FieldDescriptor*>& fields,
    std::set<string>* provided) const {
  for (int i = 0; i < fields.size(); i++) {
    const FieldDescriptor* field = fields[i];

    if (IgnoreField(field)) {
      continue;
    }

    string name = GetFilePath(options, field->file()) + "." +
                  JSObjectFieldName(options, field);
    provided->insert(name);
  }
}